

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.cc
# Opt level: O2

void * OPENSSL_memdup(void *data,size_t size)

{
  void *pvVar1;
  
  if (size != 0) {
    pvVar1 = OPENSSL_malloc(size);
    if (pvVar1 != (void *)0x0) {
      pvVar1 = memcpy(pvVar1,data,size);
      return pvVar1;
    }
  }
  return (void *)0x0;
}

Assistant:

void *OPENSSL_memdup(const void *data, size_t size) {
  if (size == 0) {
    return NULL;
  }

  void *ret = OPENSSL_malloc(size);
  if (ret == NULL) {
    return NULL;
  }

  OPENSSL_memcpy(ret, data, size);
  return ret;
}